

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

LogicalXorLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_logicalxor(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x34d) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x34d;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    LogicalXorLayerParams::LogicalXorLayerParams(this_00.logicalxor_);
    (this->layer_).logicalxor_ = (LogicalXorLayerParams *)this_00;
  }
  return (LogicalXorLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::LogicalXorLayerParams* NeuralNetworkLayer::mutable_logicalxor() {
  if (!has_logicalxor()) {
    clear_layer();
    set_has_logicalxor();
    layer_.logicalxor_ = new ::CoreML::Specification::LogicalXorLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.logicalXor)
  return layer_.logicalxor_;
}